

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTimestamp.cxx
# Opt level: O0

string * __thiscall
cmTimestamp::CurrentTime
          (string *__return_storage_ptr__,cmTimestamp *this,string *formatString,bool utcFlag)

{
  undefined4 microseconds_00;
  long timeT;
  byte bVar1;
  ulong uVar2;
  string local_240;
  undefined4 local_220;
  allocator<char> local_219;
  string local_218;
  istringstream local_1f8 [8];
  istringstream iss;
  undefined1 local_68 [8];
  string source_date_epoch;
  long lStack_40;
  uint32_t microseconds;
  time_t currentTimeT;
  uv_timeval64_t timeval;
  bool utcFlag_local;
  string *formatString_local;
  cmTimestamp *this_local;
  
  timeval._15_1_ = utcFlag;
  uv_gettimeofday((uv_timeval64_t *)&currentTimeT);
  lStack_40 = currentTimeT;
  source_date_epoch.field_2._12_4_ = (undefined4)timeval.tv_sec;
  std::__cxx11::string::string((string *)local_68);
  cmsys::SystemTools::GetEnv("SOURCE_DATE_EPOCH",(string *)local_68);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    std::__cxx11::istringstream::istringstream(local_1f8,(string *)local_68,_S_in);
    std::istream::operator>>(local_1f8,&stack0xffffffffffffffc0);
    bVar1 = std::ios::fail();
    if (((bVar1 & 1) != 0) || (bVar1 = std::ios::eof(), (bVar1 & 1) == 0)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_218,"Cannot parse SOURCE_DATE_EPOCH as integer",&local_219);
      cmSystemTools::Error(&local_218);
      std::__cxx11::string::~string((string *)&local_218);
      std::allocator<char>::~allocator(&local_219);
      exit(0x1b);
    }
    source_date_epoch.field_2._12_4_ = 0;
    std::__cxx11::istringstream::~istringstream(local_1f8);
  }
  timeT = lStack_40;
  microseconds_00 = source_date_epoch.field_2._12_4_;
  if (lStack_40 == -1) {
    std::__cxx11::string::string((string *)__return_storage_ptr__);
  }
  else {
    std::__cxx11::string::string((string *)&local_240,(string *)formatString);
    CreateTimestampFromTimeT
              (__return_storage_ptr__,this,timeT,microseconds_00,&local_240,
               (bool)(timeval._15_1_ & 1));
    std::__cxx11::string::~string((string *)&local_240);
  }
  local_220 = 1;
  std::__cxx11::string::~string((string *)local_68);
  return __return_storage_ptr__;
}

Assistant:

std::string cmTimestamp::CurrentTime(const std::string& formatString,
                                     bool utcFlag) const
{
  // get current time with microsecond resolution
  uv_timeval64_t timeval;
  uv_gettimeofday(&timeval);
  auto currentTimeT = static_cast<time_t>(timeval.tv_sec);
  auto microseconds = static_cast<uint32_t>(timeval.tv_usec);

  // check for override via SOURCE_DATE_EPOCH for reproducible builds
  std::string source_date_epoch;
  cmSystemTools::GetEnv("SOURCE_DATE_EPOCH", source_date_epoch);
  if (!source_date_epoch.empty()) {
    std::istringstream iss(source_date_epoch);
    iss >> currentTimeT;
    if (iss.fail() || !iss.eof()) {
      cmSystemTools::Error("Cannot parse SOURCE_DATE_EPOCH as integer");
      exit(27);
    }
    // SOURCE_DATE_EPOCH has only a resolution in the seconds range
    microseconds = 0;
  }
  if (currentTimeT == static_cast<time_t>(-1)) {
    return std::string();
  }

  return this->CreateTimestampFromTimeT(currentTimeT, microseconds,
                                        formatString, utcFlag);
}